

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::throw_key_not_found_error
          (basic_value<toml::type_config> *this,string *funcname,key_type *key)

{
  out_of_range *this_00;
  error_info *in_stack_00000118;
  key_type *in_stack_00000258;
  string *in_stack_00000260;
  basic_value<toml::type_config> *in_stack_00000268;
  string local_38 [56];
  
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  toml::detail::make_not_found_error<toml::type_config>
            (in_stack_00000268,in_stack_00000260,in_stack_00000258);
  format_error_abi_cxx11_(in_stack_00000118);
  std::out_of_range::out_of_range(this_00,local_38);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

[[noreturn]]
    void throw_key_not_found_error(const std::string& funcname, const key_type& key) const
    {
        throw std::out_of_range(format_error(
                    detail::make_not_found_error(*this, funcname, key)));
    }